

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O1

void deqp::gles31::Functional::anon_unknown_0::generateUniformBlockOffsetContents
               (Context *context,SharedPtr *parentStructure,TestCaseGroup *targetGroup)

{
  TestNode *pTVar1;
  Node *pNVar2;
  Node *pNVar3;
  SharedPtrStateBase *pSVar4;
  ResourceTestCase *pRVar5;
  SharedPtrStateBase *pSVar6;
  deInt32 *pdVar7;
  bool bVar8;
  SharedPtr arrayElement;
  SharedPtr memberVariable;
  SharedPtr structMember;
  SharedPtr elementVariable;
  ProgramResourceQueryTestTarget queryTarget;
  SharedPtrStateBase *pSStack_90;
  SharedPtr local_88;
  Node *local_78;
  SharedPtrStateBase *pSStack_70;
  MatrixOrder local_68;
  SharedPtr local_58;
  ProgramResourceQueryTestTarget local_40;
  TestNode *local_38;
  
  bVar8 = false;
  ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
            (&local_40,PROGRAMINTERFACE_UNIFORM,0x200);
  pNVar2 = parentStructure->m_ptr;
  if (pNVar2->m_type == TYPE_INTERFACE_BLOCK) {
    if (*(char *)&pNVar2[1]._vptr_Node == '\x01') {
      bVar8 = ((pNVar2->m_enclosingNode).m_ptr)->m_type != TYPE_ARRAY_ELEMENT;
    }
    else {
      bVar8 = false;
    }
  }
  if (pNVar2->m_type == TYPE_INTERFACE_BLOCK) {
    if (!bVar8) {
      generateVariableCases(context,parentStructure,targetGroup,&local_40,1,true);
      generateVariableArrayCases(context,parentStructure,targetGroup,&local_40,1);
      generateCompoundVariableCases(context,parentStructure,targetGroup,&local_40,1);
      return;
    }
    pTVar1 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)pTVar1,context->m_testCtx,"types","Types");
    tcu::TestNode::addChild(&targetGroup->super_TestNode,pTVar1);
    generateVariableCases(context,parentStructure,(TestCaseGroup *)pTVar1,&local_40,3,false);
    generateOpaqueTypeCases(context,parentStructure,(TestCaseGroup *)pTVar1,&local_40,3,false);
    pTVar1 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar1,context->m_testCtx,"aggregates","Aggregate types");
    tcu::TestNode::addChild(&targetGroup->super_TestNode,pTVar1);
    pNVar2 = (Node *)operator_new(0x20);
    pNVar2->_vptr_Node = (_func_int **)&PTR__Node_00b52778;
    pNVar2->m_type = TYPE_STRUCT_MEMBER;
    (pNVar2->m_enclosingNode).m_ptr = parentStructure->m_ptr;
    pSVar4 = parentStructure->m_state;
    (pNVar2->m_enclosingNode).m_state = pSVar4;
    if (pSVar4 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pSVar4->strongRefCount = pSVar4->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar7 = &((pNVar2->m_enclosingNode).m_state)->weakRefCount;
      *pdVar7 = *pdVar7 + 1;
      UNLOCK();
    }
    pNVar2->_vptr_Node = (_func_int **)&PTR__Node_00b52978;
    pSStack_70 = (SharedPtrStateBase *)0x0;
    local_78 = pNVar2;
    pSStack_70 = (SharedPtrStateBase *)operator_new(0x20);
    pSStack_70->strongRefCount = 0;
    pSStack_70->weakRefCount = 0;
    pSStack_70->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b52798;
    pSStack_70[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar2;
    pSStack_70->strongRefCount = 1;
    pSStack_70->weakRefCount = 1;
    pNVar2 = (Node *)operator_new(0x20);
    pNVar2->_vptr_Node = (_func_int **)&PTR__Node_00b52778;
    pNVar2->m_type = TYPE_STRUCT_MEMBER;
    (pNVar2->m_enclosingNode).m_ptr = parentStructure->m_ptr;
    pSVar4 = parentStructure->m_state;
    (pNVar2->m_enclosingNode).m_state = pSVar4;
    if (pSVar4 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pSVar4->strongRefCount = pSVar4->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar7 = &((pNVar2->m_enclosingNode).m_state)->weakRefCount;
      *pdVar7 = *pdVar7 + 1;
      UNLOCK();
    }
    pNVar2->_vptr_Node = (_func_int **)&PTR__Node_00b52978;
    pSStack_90 = (SharedPtrStateBase *)operator_new(0x20);
    pSStack_90->strongRefCount = 0;
    pSStack_90->weakRefCount = 0;
    pSStack_90->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b52798;
    pSStack_90[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar2;
    pSStack_90->strongRefCount = 1;
    pSStack_90->weakRefCount = 1;
    pNVar3 = (Node *)operator_new(0x28);
    pNVar3->_vptr_Node = (_func_int **)&PTR__Node_00b52778;
    pNVar3->m_type = TYPE_VARIABLE;
    (pNVar3->m_enclosingNode).m_ptr = local_78;
    (pNVar3->m_enclosingNode).m_state = pSStack_70;
    if (pSStack_70 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pSStack_70->strongRefCount = pSStack_70->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar7 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
      *pdVar7 = *pdVar7 + 1;
      UNLOCK();
    }
    pNVar3->_vptr_Node = (_func_int **)&PTR__Node_00b528f0;
    *(undefined4 *)&pNVar3[1]._vptr_Node = 1;
    local_88.m_state = (SharedPtrStateBase *)0x0;
    local_88.m_ptr = pNVar3;
    local_88.m_state = (SharedPtrStateBase *)operator_new(0x20);
    (local_88.m_state)->strongRefCount = 0;
    (local_88.m_state)->weakRefCount = 0;
    (local_88.m_state)->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b52798;
    local_88.m_state[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
    (local_88.m_state)->strongRefCount = 1;
    (local_88.m_state)->weakRefCount = 1;
    pNVar3 = (Node *)operator_new(0x28);
    pNVar3->_vptr_Node = (_func_int **)&PTR__Node_00b52778;
    pNVar3->m_type = TYPE_VARIABLE;
    (pNVar3->m_enclosingNode).m_ptr = pNVar2;
    (pNVar3->m_enclosingNode).m_state = pSStack_90;
    if (pSStack_90 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pSStack_90->strongRefCount = pSStack_90->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar7 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
      *pdVar7 = *pdVar7 + 1;
      UNLOCK();
    }
    pNVar3->_vptr_Node = (_func_int **)&PTR__Node_00b528f0;
    *(undefined4 *)&pNVar3[1]._vptr_Node = 1;
    local_58.m_state = (SharedPtrStateBase *)0x0;
    local_58.m_ptr = pNVar3;
    pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar4->strongRefCount = 0;
    pSVar4->weakRefCount = 0;
    pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b52798;
    pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
    pSVar4->strongRefCount = 1;
    pSVar4->weakRefCount = 1;
    local_58.m_state = pSVar4;
    pRVar5 = (ResourceTestCase *)operator_new(0xb0);
    ResourceTestCase::ResourceTestCase(pRVar5,context,&local_88,&local_40,"float_struct");
    tcu::TestNode::addChild(pTVar1,(TestNode *)pRVar5);
    pRVar5 = (ResourceTestCase *)operator_new(0xb0);
    ResourceTestCase::ResourceTestCase(pRVar5,context,&local_58,&local_40,"float_array");
    tcu::TestNode::addChild(pTVar1,(TestNode *)pRVar5);
  }
  else {
    pTVar1 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)pTVar1,context->m_testCtx,"types","Types");
    tcu::TestNode::addChild(&targetGroup->super_TestNode,pTVar1);
    generateVariableCases(context,parentStructure,(TestCaseGroup *)pTVar1,&local_40,3,false);
    generateOpaqueTypeCases(context,parentStructure,(TestCaseGroup *)pTVar1,&local_40,3,false);
    pTVar1 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar1,context->m_testCtx,"aggregates","Aggregate types");
    local_38 = pTVar1;
    tcu::TestNode::addChild(&targetGroup->super_TestNode,pTVar1);
    pNVar2 = (Node *)operator_new(0x38);
    glu::Layout::Layout((Layout *)&local_78,-1,-1,4,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
    pNVar2->_vptr_Node = (_func_int **)&PTR__Node_00b52778;
    pNVar2->m_type = TYPE_LAYOUT_QUALIFIER;
    (pNVar2->m_enclosingNode).m_ptr = parentStructure->m_ptr;
    pSVar4 = parentStructure->m_state;
    (pNVar2->m_enclosingNode).m_state = pSVar4;
    if (pSVar4 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pSVar4->strongRefCount = pSVar4->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar7 = &((pNVar2->m_enclosingNode).m_state)->weakRefCount;
      *pdVar7 = *pdVar7 + 1;
      UNLOCK();
    }
    pNVar2->_vptr_Node = (_func_int **)&PTR__Node_00b52a10;
    pNVar2[1]._vptr_Node = (_func_int **)local_78;
    *(SharedPtrStateBase **)&pNVar2[1].m_type = pSStack_70;
    *(MatrixOrder *)&pNVar2[1].m_enclosingNode.m_ptr = local_68;
    pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar4->strongRefCount = 0;
    pSVar4->weakRefCount = 0;
    pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b52798;
    pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar2;
    pSVar4->strongRefCount = 1;
    pSVar4->weakRefCount = 1;
    pNVar3 = (Node *)operator_new(0x28);
    pNVar3->_vptr_Node = (_func_int **)&PTR__Node_00b52778;
    pNVar3->m_type = TYPE_ARRAY_ELEMENT;
    (pNVar3->m_enclosingNode).m_ptr = pNVar2;
    (pNVar3->m_enclosingNode).m_state = pSVar4;
    LOCK();
    pSVar4->strongRefCount = pSVar4->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar7 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
    *pdVar7 = *pdVar7 + 1;
    UNLOCK();
    pNVar3->_vptr_Node = (_func_int **)&PTR__Node_00b528b8;
    *(undefined4 *)&pNVar3[1]._vptr_Node = 0xffffffff;
    pSStack_70 = (SharedPtrStateBase *)0x0;
    local_78 = pNVar3;
    pSVar6 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar6->strongRefCount = 0;
    pSVar6->weakRefCount = 0;
    pSVar6->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b52798;
    pSVar6[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
    pSVar6->strongRefCount = 1;
    pSVar6->weakRefCount = 1;
    pSStack_70 = pSVar6;
    pNVar2 = (Node *)operator_new(0x28);
    pNVar2->_vptr_Node = (_func_int **)&PTR__Node_00b52778;
    pNVar2->m_type = TYPE_VARIABLE;
    (pNVar2->m_enclosingNode).m_ptr = pNVar3;
    (pNVar2->m_enclosingNode).m_state = pSVar6;
    LOCK();
    pSVar6->strongRefCount = pSVar6->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar7 = &((pNVar2->m_enclosingNode).m_state)->weakRefCount;
    *pdVar7 = *pdVar7 + 1;
    UNLOCK();
    pNVar2->_vptr_Node = (_func_int **)&PTR__Node_00b528f0;
    *(undefined4 *)&pNVar2[1]._vptr_Node = 0x54;
    local_88.m_state = (SharedPtrStateBase *)0x0;
    local_88.m_ptr = pNVar2;
    pSVar6 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar6->strongRefCount = 0;
    pSVar6->weakRefCount = 0;
    pSVar6->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b52798;
    pSVar6[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar2;
    pSVar6->strongRefCount = 1;
    pSVar6->weakRefCount = 1;
    local_88.m_state = pSVar6;
    pRVar5 = (ResourceTestCase *)operator_new(0xb0);
    pTVar1 = local_38;
    ResourceTestCase::ResourceTestCase(pRVar5,context,&local_88,&local_40,"atomic_uint_array");
    tcu::TestNode::addChild(pTVar1,(TestNode *)pRVar5);
    pdVar7 = &pSVar6->strongRefCount;
    LOCK();
    *pdVar7 = *pdVar7 + -1;
    UNLOCK();
    if (*pdVar7 == 0) {
      local_88.m_ptr = (Node *)0x0;
      (*(local_88.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar7 = &(local_88.m_state)->weakRefCount;
    *pdVar7 = *pdVar7 + -1;
    UNLOCK();
    if (*pdVar7 == 0) {
      if (local_88.m_state != (SharedPtrStateBase *)0x0) {
        (*(local_88.m_state)->_vptr_SharedPtrStateBase[1])();
      }
      local_88.m_state = (SharedPtrStateBase *)0x0;
    }
    if (pSStack_70 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar7 = &pSStack_70->strongRefCount;
      *pdVar7 = *pdVar7 + -1;
      UNLOCK();
      if (*pdVar7 == 0) {
        local_78 = (Node *)0x0;
        (*pSStack_70->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar7 = &pSStack_70->weakRefCount;
      *pdVar7 = *pdVar7 + -1;
      UNLOCK();
      if (*pdVar7 == 0) {
        if (pSStack_70 != (SharedPtrStateBase *)0x0) {
          (*pSStack_70->_vptr_SharedPtrStateBase[1])();
        }
        pSStack_70 = (SharedPtrStateBase *)0x0;
      }
    }
    if (pSVar4 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar7 = &pSVar4->strongRefCount;
      *pdVar7 = *pdVar7 + -1;
      UNLOCK();
      if (*pdVar7 == 0) {
        (*pSVar4->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar7 = &pSVar4->weakRefCount;
      *pdVar7 = *pdVar7 + -1;
      UNLOCK();
      if ((*pdVar7 == 0) && (pSVar4 != (SharedPtrStateBase *)0x0)) {
        (*pSVar4->_vptr_SharedPtrStateBase[1])();
      }
    }
    pNVar2 = (Node *)operator_new(0x20);
    pNVar2->_vptr_Node = (_func_int **)&PTR__Node_00b52778;
    pNVar2->m_type = TYPE_STRUCT_MEMBER;
    (pNVar2->m_enclosingNode).m_ptr = parentStructure->m_ptr;
    pSVar4 = parentStructure->m_state;
    (pNVar2->m_enclosingNode).m_state = pSVar4;
    if (pSVar4 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pSVar4->strongRefCount = pSVar4->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar7 = &((pNVar2->m_enclosingNode).m_state)->weakRefCount;
      *pdVar7 = *pdVar7 + 1;
      UNLOCK();
    }
    pNVar2->_vptr_Node = (_func_int **)&PTR__Node_00b52978;
    pSStack_70 = (SharedPtrStateBase *)0x0;
    local_78 = pNVar2;
    pSStack_70 = (SharedPtrStateBase *)operator_new(0x20);
    pSStack_70->strongRefCount = 0;
    pSStack_70->weakRefCount = 0;
    pSStack_70->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b52798;
    pSStack_70[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar2;
    pSStack_70->strongRefCount = 1;
    pSStack_70->weakRefCount = 1;
    pNVar2 = (Node *)operator_new(0x28);
    pNVar2->_vptr_Node = (_func_int **)&PTR__Node_00b52778;
    pNVar2->m_type = TYPE_ARRAY_ELEMENT;
    (pNVar2->m_enclosingNode).m_ptr = parentStructure->m_ptr;
    pSVar4 = parentStructure->m_state;
    (pNVar2->m_enclosingNode).m_state = pSVar4;
    if (pSVar4 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pSVar4->strongRefCount = pSVar4->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar7 = &((pNVar2->m_enclosingNode).m_state)->weakRefCount;
      *pdVar7 = *pdVar7 + 1;
      UNLOCK();
    }
    pNVar2->_vptr_Node = (_func_int **)&PTR__Node_00b528b8;
    *(undefined4 *)&pNVar2[1]._vptr_Node = 0xffffffff;
    pSStack_90 = (SharedPtrStateBase *)operator_new(0x20);
    pSStack_90->strongRefCount = 0;
    pSStack_90->weakRefCount = 0;
    pSStack_90->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b52798;
    pSStack_90[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar2;
    pSStack_90->strongRefCount = 1;
    pSStack_90->weakRefCount = 1;
    pNVar3 = (Node *)operator_new(0x28);
    pNVar3->_vptr_Node = (_func_int **)&PTR__Node_00b52778;
    pNVar3->m_type = TYPE_VARIABLE;
    (pNVar3->m_enclosingNode).m_ptr = local_78;
    (pNVar3->m_enclosingNode).m_state = pSStack_70;
    if (pSStack_70 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pSStack_70->strongRefCount = pSStack_70->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar7 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
      *pdVar7 = *pdVar7 + 1;
      UNLOCK();
    }
    pNVar3->_vptr_Node = (_func_int **)&PTR__Node_00b528f0;
    *(undefined4 *)&pNVar3[1]._vptr_Node = 1;
    local_88.m_state = (SharedPtrStateBase *)0x0;
    local_88.m_ptr = pNVar3;
    local_88.m_state = (SharedPtrStateBase *)operator_new(0x20);
    (local_88.m_state)->strongRefCount = 0;
    (local_88.m_state)->weakRefCount = 0;
    (local_88.m_state)->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b52798;
    local_88.m_state[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
    (local_88.m_state)->strongRefCount = 1;
    (local_88.m_state)->weakRefCount = 1;
    pNVar3 = (Node *)operator_new(0x28);
    pNVar3->_vptr_Node = (_func_int **)&PTR__Node_00b52778;
    pNVar3->m_type = TYPE_VARIABLE;
    (pNVar3->m_enclosingNode).m_ptr = pNVar2;
    (pNVar3->m_enclosingNode).m_state = pSStack_90;
    if (pSStack_90 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pSStack_90->strongRefCount = pSStack_90->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar7 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
      *pdVar7 = *pdVar7 + 1;
      UNLOCK();
    }
    pNVar3->_vptr_Node = (_func_int **)&PTR__Node_00b528f0;
    *(undefined4 *)&pNVar3[1]._vptr_Node = 1;
    local_58.m_state = (SharedPtrStateBase *)0x0;
    local_58.m_ptr = pNVar3;
    pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar4->strongRefCount = 0;
    pSVar4->weakRefCount = 0;
    pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b52798;
    pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
    pSVar4->strongRefCount = 1;
    pSVar4->weakRefCount = 1;
    local_58.m_state = pSVar4;
    pRVar5 = (ResourceTestCase *)operator_new(0xb0);
    ResourceTestCase::ResourceTestCase(pRVar5,context,&local_88,&local_40,"float_struct");
    tcu::TestNode::addChild(pTVar1,(TestNode *)pRVar5);
    pRVar5 = (ResourceTestCase *)operator_new(0xb0);
    ResourceTestCase::ResourceTestCase(pRVar5,context,&local_58,&local_40,"float_array");
    tcu::TestNode::addChild(pTVar1,(TestNode *)pRVar5);
  }
  pdVar7 = &pSVar4->strongRefCount;
  LOCK();
  *pdVar7 = *pdVar7 + -1;
  UNLOCK();
  if (*pdVar7 == 0) {
    local_58.m_ptr = (Node *)0x0;
    (*(local_58.m_state)->_vptr_SharedPtrStateBase[2])();
  }
  LOCK();
  pdVar7 = &(local_58.m_state)->weakRefCount;
  *pdVar7 = *pdVar7 + -1;
  UNLOCK();
  if (*pdVar7 == 0) {
    if (local_58.m_state != (SharedPtrStateBase *)0x0) {
      (*(local_58.m_state)->_vptr_SharedPtrStateBase[1])();
    }
    local_58.m_state = (SharedPtrStateBase *)0x0;
  }
  if (local_88.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar7 = &(local_88.m_state)->strongRefCount;
    *pdVar7 = *pdVar7 + -1;
    UNLOCK();
    if (*pdVar7 == 0) {
      local_88.m_ptr = (Node *)0x0;
      (*(local_88.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar7 = &(local_88.m_state)->weakRefCount;
    *pdVar7 = *pdVar7 + -1;
    UNLOCK();
    if (*pdVar7 == 0) {
      if (local_88.m_state != (SharedPtrStateBase *)0x0) {
        (*(local_88.m_state)->_vptr_SharedPtrStateBase[1])();
      }
      local_88.m_state = (SharedPtrStateBase *)0x0;
    }
  }
  if (pSStack_90 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar7 = &pSStack_90->strongRefCount;
    *pdVar7 = *pdVar7 + -1;
    UNLOCK();
    if (*pdVar7 == 0) {
      (*pSStack_90->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar7 = &pSStack_90->weakRefCount;
    *pdVar7 = *pdVar7 + -1;
    UNLOCK();
    if ((*pdVar7 == 0) && (pSStack_90 != (SharedPtrStateBase *)0x0)) {
      (*pSStack_90->_vptr_SharedPtrStateBase[1])();
    }
  }
  if (pSStack_70 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar7 = &pSStack_70->strongRefCount;
    *pdVar7 = *pdVar7 + -1;
    UNLOCK();
    if (*pdVar7 == 0) {
      local_78 = (Node *)0x0;
      (*pSStack_70->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar7 = &pSStack_70->weakRefCount;
    *pdVar7 = *pdVar7 + -1;
    UNLOCK();
    if ((*pdVar7 == 0) && (pSStack_70 != (SharedPtrStateBase *)0x0)) {
      (*pSStack_70->_vptr_SharedPtrStateBase[1])();
    }
  }
  return;
}

Assistant:

static void generateUniformBlockOffsetContents (Context& context, const ResourceDefinition::Node::SharedPtr& parentStructure, tcu::TestCaseGroup* const targetGroup)
{
	const ProgramResourceQueryTestTarget	queryTarget			(PROGRAMINTERFACE_UNIFORM, PROGRAMRESOURCEPROP_OFFSET);
	const bool								isInterfaceBlock	= (parentStructure->getType() == ResourceDefinition::Node::TYPE_INTERFACE_BLOCK);
	const bool								namedNonArrayBlock	= isInterfaceBlock																					&&
																  static_cast<const ResourceDefinition::InterfaceBlock*>(parentStructure.get())->m_named			&&
																  parentStructure->getEnclosingNode()->getType() != ResourceDefinition::Node::TYPE_ARRAY_ELEMENT;

	if (!isInterfaceBlock)
	{
		// .types
		{
			tcu::TestCaseGroup* const blockGroup = new tcu::TestCaseGroup(context.getTestContext(), "types", "Types");
			targetGroup->addChild(blockGroup);

			generateVariableCases(context, parentStructure, blockGroup, queryTarget, 3, false);
			generateOpaqueTypeCases(context, parentStructure, blockGroup, queryTarget, 3, false);
		}

		// .aggregates
		{
			tcu::TestCaseGroup* const blockGroup = new tcu::TestCaseGroup(context.getTestContext(), "aggregates", "Aggregate types");
			targetGroup->addChild(blockGroup);

			// .atomic_uint_struct
			// .atomic_uint_array
			{
				const ResourceDefinition::Node::SharedPtr offset			(new ResourceDefinition::LayoutQualifier(parentStructure, glu::Layout(-1, -1, 4)));
				const ResourceDefinition::Node::SharedPtr arrayElement		(new ResourceDefinition::ArrayElement(offset));
				const ResourceDefinition::Node::SharedPtr elementVariable	(new ResourceDefinition::Variable(arrayElement, glu::TYPE_UINT_ATOMIC_COUNTER));

				blockGroup->addChild(new ResourceTestCase(context, elementVariable, queryTarget, "atomic_uint_array"));
			}

			// .float_array
			// .float_struct
			{
				const ResourceDefinition::Node::SharedPtr structMember		(new ResourceDefinition::StructMember(parentStructure));
				const ResourceDefinition::Node::SharedPtr arrayElement		(new ResourceDefinition::ArrayElement(parentStructure));
				const ResourceDefinition::Node::SharedPtr memberVariable	(new ResourceDefinition::Variable(structMember, glu::TYPE_FLOAT));
				const ResourceDefinition::Node::SharedPtr elementVariable	(new ResourceDefinition::Variable(arrayElement, glu::TYPE_FLOAT));

				blockGroup->addChild(new ResourceTestCase(context, memberVariable, queryTarget, "float_struct"));
				blockGroup->addChild(new ResourceTestCase(context, elementVariable, queryTarget, "float_array"));
			}
		}
	}
	else if (namedNonArrayBlock)
	{
		// .types
		{
			tcu::TestCaseGroup* const blockGroup = new tcu::TestCaseGroup(context.getTestContext(), "types", "Types");
			targetGroup->addChild(blockGroup);

			generateVariableCases(context, parentStructure, blockGroup, queryTarget, 3, false);
			generateOpaqueTypeCases(context, parentStructure, blockGroup, queryTarget, 3, false);
		}

		// .aggregates
		{
			tcu::TestCaseGroup* const blockGroup = new tcu::TestCaseGroup(context.getTestContext(), "aggregates", "Aggregate types");
			targetGroup->addChild(blockGroup);

			// .float_array
			// .float_struct
			{
				const ResourceDefinition::Node::SharedPtr structMember		(new ResourceDefinition::StructMember(parentStructure));
				const ResourceDefinition::Node::SharedPtr arrayElement		(new ResourceDefinition::StructMember(parentStructure));
				const ResourceDefinition::Node::SharedPtr memberVariable	(new ResourceDefinition::Variable(structMember, glu::TYPE_FLOAT));
				const ResourceDefinition::Node::SharedPtr elementVariable	(new ResourceDefinition::Variable(arrayElement, glu::TYPE_FLOAT));

				blockGroup->addChild(new ResourceTestCase(context, memberVariable, queryTarget, "float_struct"));
				blockGroup->addChild(new ResourceTestCase(context, elementVariable, queryTarget, "float_array"));
			}
		}
	}
	else
	{
		generateVariableCases(context, parentStructure, targetGroup, queryTarget, 1);
		generateVariableArrayCases(context, parentStructure, targetGroup, queryTarget, 1);
		generateCompoundVariableCases(context, parentStructure, targetGroup, queryTarget, 1);
	}
}